

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toplevel_unit.c
# Opt level: O0

_Bool deserialization_test(char *data,size_t size)

{
  _Bool _Var1;
  uint32_t val;
  roaring_bitmap_t *r;
  uint64_t uVar2;
  roaring_bitmap_t *in_RSI;
  uint32_t new_cardinality;
  uint32_t i;
  uint32_t cardinality;
  char *reason_failure;
  roaring_bitmap_t *bitmap;
  uint local_30;
  roaring_bitmap_t *r_00;
  size_t in_stack_ffffffffffffffe0;
  
  r = roaring_bitmap_portable_deserialize_safe((char *)in_RSI,in_stack_ffffffffffffffe0);
  if (r != (roaring_bitmap_t *)0x0) {
    r_00 = (roaring_bitmap_t *)0x0;
    _Var1 = roaring_bitmap_internal_validate(in_RSI,(char **)r);
    if (_Var1) {
      uVar2 = roaring_bitmap_get_cardinality(r);
      val = (uint32_t)uVar2;
      for (local_30 = 100; local_30 < 1000; local_30 = local_30 + 1) {
        _Var1 = roaring_bitmap_contains(r_00,val);
        if (!_Var1) {
          val = val + 1;
          roaring_bitmap_add((roaring_bitmap_t *)reason_failure,cardinality);
        }
      }
      uVar2 = roaring_bitmap_get_cardinality(r);
      if (val != (uint32_t)uVar2) {
        return false;
      }
    }
    roaring_bitmap_free((roaring_bitmap_t *)0x10a991);
  }
  return true;
}

Assistant:

bool deserialization_test(const char *data, size_t size) {
    // We test that deserialization never fails.
    roaring_bitmap_t *bitmap =
        roaring_bitmap_portable_deserialize_safe(data, size);
    if (bitmap) {
        // The bitmap may not be usable if it does not follow the specification.
        // We can validate the bitmap we recovered to make sure it is proper.
        const char *reason_failure = NULL;
        if (roaring_bitmap_internal_validate(bitmap, &reason_failure)) {
            // the bitmap is ok!
            uint32_t cardinality = roaring_bitmap_get_cardinality(bitmap);

            for (uint32_t i = 100; i < 1000; i++) {
                if (!roaring_bitmap_contains(bitmap, i)) {
                    cardinality++;
                    roaring_bitmap_add(bitmap, i);
                }
            }

            uint32_t new_cardinality = roaring_bitmap_get_cardinality(bitmap);
            if (cardinality != new_cardinality) {
                return false;
            }
        }
        roaring_bitmap_free(bitmap);
    }
    return true;
}